

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

optional<tinyusdz::Orientation> *
tinyusdz::OrientationFromString(optional<tinyusdz::Orientation> *__return_storage_ptr__,string *v)

{
  bool bVar1;
  storage_t<tinyusdz::Orientation> sVar2;
  
  bVar1 = ::std::operator==("rightHanded",v);
  if (bVar1) {
    sVar2 = (storage_t<tinyusdz::Orientation>)0x0;
    bVar1 = true;
  }
  else {
    bVar1 = ::std::operator==("leftHanded",v);
    sVar2._1_3_ = 0;
    sVar2._0_1_ = bVar1;
  }
  __return_storage_ptr__->has_value_ = bVar1;
  __return_storage_ptr__->contained = sVar2;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Orientation> OrientationFromString(const std::string &v) {
  if ("rightHanded" == v) {
    return Orientation::RightHanded;
  } else if ("leftHanded" == v) {
    return Orientation::LeftHanded;
  }
  return nonstd::nullopt;
}